

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Vdbe * allocVdbe(Parse *pParse)

{
  Vdbe *p;
  
  p = sqlite3VdbeCreate(pParse);
  pParse->pVdbe = p;
  if (p != (Vdbe *)0x0) {
    sqlite3VdbeAddOp3(p,0x33,0,1,0);
  }
  if ((pParse->pToplevel == (Parse *)0x0) && ((pParse->db->dbOptFlags & 8) == 0)) {
    pParse->okConstFactor = '\x01';
  }
  return p;
}

Assistant:

static SQLITE_NOINLINE Vdbe *allocVdbe(Parse *pParse){
  Vdbe *v = pParse->pVdbe = sqlite3VdbeCreate(pParse);
  if( v ) sqlite3VdbeAddOp2(v, OP_Init, 0, 1);
  if( pParse->pToplevel==0
   && OptimizationEnabled(pParse->db,SQLITE_FactorOutConst)
  ){
    pParse->okConstFactor = 1;
  }
  return v;
}